

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UChar32 u_charFromName_63(UCharNameChoice nameChoice,char *name,UErrorCode *pErrorCode)

{
  uint uVar1;
  UBool UVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  ushort count;
  UErrorCode UVar16;
  uint *puVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  uint16_t indexes [8];
  char lower [120];
  char *local_178 [8];
  FindName findName;
  char upper [120];
  char *elementBases [8];
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0xffff;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0xffff;
  }
  UVar16 = U_ILLEGAL_ARGUMENT_ERROR;
  if ((name != (char *)0x0 && (int)nameChoice < 4) && (*name != '\0')) {
    UVar2 = icu_63::isDataLoaded(pErrorCode);
    if (UVar2 == '\0') {
      return 0xffff;
    }
    uVar15 = 0;
    UVar16 = U_ILLEGAL_CHAR_FOUND;
    for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 1) {
      cVar4 = name[lVar18];
      if (cVar4 == '\0') {
        lower[lVar18] = '\0';
        upper[lVar18] = '\0';
        if (lower[0] != '<') {
          puVar17 = (uint *)((long)&icu_63::uCharNames->groupsOffset +
                            (ulong)icu_63::uCharNames->algNamesOffset);
          uVar15 = puVar17[-1];
          goto LAB_001ba90e;
        }
        if ((((nameChoice == U_EXTENDED_CHAR_NAME) && (uVar15 < 0xfffffffd)) &&
            (lower[~uVar15] == '>')) && (lower[-uVar15 - 2] != '-')) {
          if (2 < -uVar15 - 2) {
            uVar15 = -uVar15 - 2;
            uVar11 = (ulong)uVar15;
            goto LAB_001ba8c5;
          }
          uVar15 = 2;
          goto LAB_001babc0;
        }
        break;
      }
      cVar3 = uprv_toupper_63(cVar4);
      upper[lVar18] = cVar3;
      cVar4 = uprv_asciitolower_63(cVar4);
      lower[lVar18] = cVar4;
      uVar15 = uVar15 - 1;
    }
  }
  goto LAB_001bab9e;
LAB_001ba90e:
  UVar16 = U_ILLEGAL_CHAR_FOUND;
  bVar21 = uVar15 != 0;
  uVar15 = uVar15 - 1;
  if (bVar21) {
    if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
      if ((char)puVar17[2] != '\x01') {
        if ((char)puVar17[2] == '\0') {
          puVar12 = puVar17 + 3;
          pcVar8 = upper;
          do {
            uVar19 = *puVar12;
            if ((char)uVar19 == '\0') {
              lVar18 = 0;
              uVar19 = 0;
              goto LAB_001ba9a5;
            }
            puVar12 = (uint *)((long)puVar12 + 1);
            cVar4 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while ((char)uVar19 == cVar4);
        }
        goto LAB_001ba921;
      }
      pcVar13 = (char *)((long)puVar17 + (ulong)*(byte *)((long)puVar17 + 9) * 2 + 0xd);
      pcVar8 = upper;
      do {
        pcVar14 = pcVar13 + -1;
        if (*pcVar14 == '\0') {
          uVar19 = *puVar17;
          uVar1 = puVar17[1];
          count = (ushort)*(byte *)((long)puVar17 + 9);
          icu_63::writeFactorSuffix
                    ((uint16_t *)(puVar17 + 3),count,pcVar13,0,indexes,elementBases,local_178,
                     (char *)&findName,0x40);
          iVar20 = strcmp(pcVar8,(char *)&findName);
          if (iVar20 == 0) goto LAB_001bab52;
          goto LAB_001baa5b;
        }
        pcVar13 = pcVar13 + 1;
        cVar4 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (*pcVar14 == cVar4);
      uVar19 = 0xffff;
      goto LAB_001bab52;
    }
    goto LAB_001ba921;
  }
  goto LAB_001bab61;
LAB_001ba9a5:
  if ((ushort)*(byte *)((long)puVar17 + 9) == (ushort)lVar18) goto LAB_001bab07;
  cVar4 = pcVar8[lVar18];
  iVar20 = -0x30;
  if ((9 < (byte)(cVar4 - 0x30U)) && (iVar20 = -0x37, 5 < (byte)(cVar4 + 0xbfU))) goto LAB_001ba921;
  uVar19 = uVar19 << 4 | iVar20 + cVar4;
  lVar18 = lVar18 + 1;
  goto LAB_001ba9a5;
LAB_001bab07:
  if (((pcVar8[*(byte *)((long)puVar17 + 9)] != '\0') || (uVar19 < *puVar17)) ||
     (puVar17[1] < uVar19)) goto LAB_001ba921;
  goto LAB_001bab52;
  while( true ) {
    while( true ) {
      uVar6 = uVar6 - 1 & 0xffff;
      uVar9 = *(short *)((long)indexes + (ulong)(uVar6 * 2)) + 1;
      if (uVar9 < *(ushort *)((long)(puVar17 + 3) + (ulong)(uVar6 * 2))) break;
      indexes[uVar6] = 0;
      *(undefined8 *)((long)local_178 + (ulong)(uVar6 * 8)) =
           *(undefined8 *)((long)elementBases + (ulong)(uVar6 * 8));
    }
    indexes[uVar6] = uVar9;
    pcVar13 = local_178[uVar6];
    do {
      cVar4 = *pcVar13;
      pcVar13 = pcVar13 + 1;
    } while (cVar4 != '\0');
    local_178[uVar6] = pcVar13;
    pcVar13 = pcVar8;
    for (uVar9 = 0; uVar9 < count; uVar9 = uVar9 + 1) {
      pcVar14 = local_178[uVar9];
      while (cVar4 = *pcVar14, cVar4 != '\0') {
        pcVar14 = pcVar14 + 1;
        cVar3 = *pcVar13;
        if (cVar4 != cVar3) {
          pcVar14 = "";
        }
        pcVar13 = pcVar13 + 1;
        if (cVar4 != cVar3) {
          uVar9 = 99;
        }
      }
    }
    if ((uVar9 < 99) && (*pcVar13 == '\0')) break;
LAB_001baa5b:
    uVar19 = uVar19 + 1;
    uVar6 = (uint)count;
    if ((int)(uVar1 + 1) <= (int)uVar19) goto LAB_001ba921;
  }
LAB_001bab52:
  if (uVar19 != 0xffff) {
    return uVar19;
  }
LAB_001ba921:
  puVar17 = (uint *)((long)puVar17 + (ulong)*(ushort *)((long)puVar17 + 10));
  goto LAB_001ba90e;
LAB_001bab61:
  findName.otherName = upper;
  findName.code = 0xffff;
  icu_63::enumNames(icu_63::uCharNames,0,0x110000,(UEnumCharNamesFn *)0x0,&findName,nameChoice);
  if (findName.code != 0xffff) {
    return findName.code;
  }
  goto LAB_001bab9e;
  while (uVar11 = uVar10, 2 < uVar10) {
LAB_001ba8c5:
    uVar10 = uVar11 - 1;
    uVar15 = uVar15 - 1;
    if (*(char *)((long)indexes + uVar11 + 0xf) == '-') break;
  }
LAB_001babc0:
  if (lower[uVar15] == '-') {
    lower[uVar15] = '\0';
    iVar20 = 0;
    while( true ) {
      uVar15 = uVar15 + 1;
      cVar4 = lower[uVar15];
      if (cVar4 == 0x3e) break;
      iVar7 = -0x30;
      if ((9 < (byte)(cVar4 - 0x30U)) && (iVar7 = -0x57, 5 < (byte)(cVar4 + 0x9fU)))
      goto LAB_001bab9e;
      iVar20 = iVar20 * 0x10 + iVar7 + (int)cVar4;
    }
    lower[uVar15] = '\0';
    for (lVar18 = 0; lVar18 != 0x108; lVar18 = lVar18 + 8) {
      iVar7 = strcmp(lower + 1,*(char **)((long)&icu_63::charCatNames + lVar18));
      if (iVar7 == 0) {
        bVar5 = icu_63::getCharCat(iVar20);
        if ((ulong)bVar5 * 8 == lVar18) {
          return iVar20;
        }
        break;
      }
    }
  }
LAB_001bab9e:
  *pErrorCode = UVar16;
  return 0xffff;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_charFromName(UCharNameChoice nameChoice,
               const char *name,
               UErrorCode *pErrorCode) {
    char upper[120], lower[120];
    FindName findName;
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;
    UChar32 cp = 0;
    char c0;
    UChar32 error = 0xffff;     /* Undefined, but use this for backwards compatibility. */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return error;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || name==NULL || *name==0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return error;
    }

    if(!isDataLoaded(pErrorCode)) {
        return error;
    }

    /* construct the uppercase and lowercase of the name first */
    for(i=0; i<sizeof(upper); ++i) {
        if((c0=*name++)!=0) {
            upper[i]=uprv_toupper(c0);
            lower[i]=uprv_tolower(c0);
        } else {
            upper[i]=lower[i]=0;
            break;
        }
    }
    if(i==sizeof(upper)) {
        /* name too long, there is no such character */
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }
    // i==strlen(name)==strlen(lower)==strlen(upper)

    /* try extended names first */
    if (lower[0] == '<') {
        if (nameChoice == U_EXTENDED_CHAR_NAME) {
            // Parse a string like "<category-HHHH>" where HHHH is a hex code point.
            if (lower[--i] == '>' && i >= 3 && lower[--i] != '-') {
                while (i >= 3 && lower[--i] != '-') {}

                if (i >= 2 && lower[i] == '-') {
                    uint32_t cIdx;

                    lower[i] = 0;

                    for (++i; lower[i] != '>'; ++i) {
                        if (lower[i] >= '0' && lower[i] <= '9') {
                            cp = (cp << 4) + lower[i] - '0';
                        } else if (lower[i] >= 'a' && lower[i] <= 'f') {
                            cp = (cp << 4) + lower[i] - 'a' + 10;
                        } else {
                            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                            return error;
                        }
                    }

                    /* Now validate the category name.
                       We could use a binary search, or a trie, if
                       we really wanted to. */

                    for (lower[i] = 0, cIdx = 0; cIdx < UPRV_LENGTHOF(charCatNames); ++cIdx) {

                        if (!uprv_strcmp(lower + 1, charCatNames[cIdx])) {
                            if (getCharCat(cp) == cIdx) {
                                return cp;
                            }
                            break;
                        }
                    }
                }
            }
        }

        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }

    /* try algorithmic names now */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        if((cp=findAlgName(algRange, nameChoice, upper))!=0xffff) {
            return cp;
        }
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }

    /* normal character name */
    findName.otherName=upper;
    findName.code=error;
    enumNames(uCharNames, 0, UCHAR_MAX_VALUE + 1, DO_FIND_NAME, &findName, nameChoice);
    if (findName.code == error) {
         *pErrorCode = U_ILLEGAL_CHAR_FOUND;
    }
    return findName.code;
}